

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

void pk_record(CHAR_DATA *ch,CHAR_DATA *victim)

{
  short *psVar1;
  PC_DATA *pPVar2;
  bool bVar3;
  undefined7 extraout_var;
  char *pcVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  CHAR_DATA *pCVar10;
  float fVar11;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  
  bVar3 = is_npc(victim);
  if (!bVar3) {
    bVar3 = is_npc(ch);
    iVar9 = (int)CONCAT71(extraout_var,bVar3);
    if (!bVar3) {
      if (char_list == (CHAR_DATA *)0x0) {
        fVar11 = 0.0;
      }
      else {
        iVar5 = 0;
        iVar9 = 0;
        iVar7 = 0;
        pCVar10 = char_list;
        do {
          bVar3 = is_same_group(pCVar10,ch);
          if (bVar3) {
            bVar3 = is_npc(pCVar10);
            if ((!bVar3) && ((pCVar10->in_room == ch->in_room || (0 < pCVar10->ghost)))) {
              fmt._M_str = "Adding {} to killer_group";
              fmt._M_len = 0x19;
              CLogger::Info<char*&>((CLogger *)&RS.field_0x140,fmt,&pCVar10->name);
              iVar7 = iVar7 + 1;
            }
          }
          bVar3 = is_same_group(pCVar10,ch);
          if ((bVar3) && (pCVar10->in_room == ch->in_room)) {
            bVar3 = is_npc(pCVar10);
            if (!bVar3) {
              fmt_00._M_str = "Adding {} to killer_in_room";
              fmt_00._M_len = 0x1b;
              CLogger::Info<char*&>((CLogger *)&RS.field_0x140,fmt_00,&pCVar10->name);
              iVar5 = iVar5 + 1;
            }
          }
          bVar3 = is_same_group(pCVar10,victim);
          if ((bVar3) && ((pCVar10->in_room == victim->in_room || (0 < pCVar10->ghost)))) {
            fmt_01._M_str = "Adding {} to victim_group.";
            fmt_01._M_len = 0x1a;
            CLogger::Info<char*&>((CLogger *)&RS.field_0x140,fmt_01,&pCVar10->name);
            iVar9 = iVar9 + 1;
          }
          pCVar10 = pCVar10->next;
        } while (pCVar10 != (CHAR_DATA *)0x0);
        iVar9 = iVar9 / iVar7;
        fVar11 = (float)iVar5;
      }
      iVar5 = 1;
      if (iVar9 < 1) {
        iVar5 = iVar9;
      }
      victim->pcdata->fragged = victim->pcdata->fragged + (float)iVar5;
      if (char_list != (CHAR_DATA *)0x0) {
        fVar11 = (float)iVar5 / fVar11;
        pCVar10 = char_list;
        do {
          bVar3 = is_same_group(pCVar10,ch);
          if (bVar3) {
            bVar3 = can_pk(pCVar10,victim);
            if (bVar3) {
              bVar3 = is_npc(pCVar10);
              if ((!bVar3) && (pCVar10->in_room == ch->in_room)) {
                pCVar10->pcdata->frags[0] = pCVar10->pcdata->frags[0] + fVar11;
                bVar3 = is_good(victim);
                lVar6 = 0xa0;
                if (bVar3) {
LAB_00299be9:
                  *(float *)((long)&pCVar10->pcdata->next + lVar6) =
                       *(float *)((long)&pCVar10->pcdata->next + lVar6) + fVar11;
                }
                else {
                  bVar3 = is_neutral(victim);
                  lVar6 = 0xa4;
                  if (bVar3) goto LAB_00299be9;
                  bVar3 = is_evil(victim);
                  lVar6 = 0xa8;
                  if (bVar3) goto LAB_00299be9;
                }
                if (pCVar10->level < 0x33) {
                  uVar8 = 0;
                  do {
                    pcVar4 = pCVar10->pcdata->recentkills[uVar8];
                    if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) goto LAB_00299c36;
                    uVar8 = uVar8 + 1;
                  } while (uVar8 != 100);
                  uVar8 = 100;
LAB_00299c36:
                  if ((uint)uVar8 < 0x5f) {
                    pcVar4 = palloc_string(victim->name);
                    pCVar10->pcdata->recentkills[uVar8 & 0xffffffff] = pcVar4;
                  }
                }
              }
            }
          }
          pCVar10 = pCVar10->next;
        } while (pCVar10 != (CHAR_DATA *)0x0);
      }
      pPVar2 = ch->pcdata;
      pPVar2->kills[0] = pPVar2->kills[0] + 1;
      if (victim->alignment < 1) {
        if (victim->alignment == 0) {
          pPVar2->kills[2] = pPVar2->kills[2] + 1;
        }
        else {
          pPVar2->kills[3] = pPVar2->kills[3] + 1;
        }
      }
      else {
        pPVar2->kills[1] = pPVar2->kills[1] + 1;
      }
      psVar1 = victim->pcdata->killed;
      *psVar1 = *psVar1 + 1;
      if (ch->level < 0x33) {
        uVar8 = 0;
        do {
          if ((pPVar2->recentkills[uVar8] == (char *)0x0) || (*pPVar2->recentkills[uVar8] == '\0'))
          goto LAB_00299cd6;
          uVar8 = uVar8 + 1;
        } while (uVar8 != 100);
        uVar8 = 100;
LAB_00299cd6:
        if ((uint)uVar8 < 0x5f) {
          pcVar4 = palloc_string(victim->name);
          ch->pcdata->recentkills[uVar8 & 0xffffffff] = pcVar4;
        }
      }
    }
  }
  return;
}

Assistant:

void pk_record(CHAR_DATA *ch, CHAR_DATA *victim)
{
	CHAR_DATA *wch;
	int killer_group = 0, victim_group = 0;
	int killer_in_room = 0;
	float killer_credit, victim_credit;
	int i;

	if (is_npc(victim) || is_npc(ch))
		return;

	for (wch = char_list; wch; wch = wch->next)
	{
		if (is_same_group(wch, ch) && !is_npc(wch) && (wch->in_room == ch->in_room || wch->ghost > 0))
		{
			RS.Logger.Info("Adding {} to killer_group", wch->name);
			killer_group++;
		}

		if (is_same_group(wch, ch) && wch->in_room == ch->in_room && !is_npc(wch))
		{
			RS.Logger.Info("Adding {} to killer_in_room", wch->name);
			killer_in_room++;
		}

		if (is_same_group(wch, victim) && (wch->in_room == victim->in_room || wch->ghost > 0))
		{
			RS.Logger.Info("Adding {} to victim_group.", wch->name);
			victim_group++;
		}
	}

	victim_credit = (float)(victim_group / killer_group);

	if (victim_credit > 1)
		victim_credit = 1;

	killer_credit = victim_credit;
	killer_credit = killer_credit / killer_in_room;
	victim->pcdata->fragged += victim_credit;

	for (wch = char_list; wch; wch = wch->next)
	{
		if (is_same_group(wch, ch) && can_pk(wch, victim) && !is_npc(wch) && wch->in_room == ch->in_room)
		{
			wch->pcdata->frags[PK_KILLS] += killer_credit;

			if (is_good(victim))
				wch->pcdata->frags[PK_GOOD] += killer_credit;
			else if (is_neutral(victim))
				wch->pcdata->frags[PK_NEUTRAL] += killer_credit;
			else if (is_evil(victim))
				wch->pcdata->frags[PK_EVIL] += killer_credit;

			if (wch->level < 51)
			{
				for (i = 0; i < 100; i++)
				{
					if (wch->pcdata->recentkills[i] == nullptr)
						break;

					if (*(wch->pcdata->recentkills[i]) == '\0')
						break;
				}

				if (i < 95)
					wch->pcdata->recentkills[i] = palloc_string(victim->name);
			}
		}
	}

	ch->pcdata->kills[PK_KILLS]++;

	if (victim->alignment > 0)
		ch->pcdata->kills[PK_GOOD]++;
	else if (victim->alignment == 0)
		ch->pcdata->kills[PK_NEUTRAL]++;
	else if (victim->alignment < 0)
		ch->pcdata->kills[PK_EVIL]++;

	victim->pcdata->killed[PK_KILLED]++;

	if (ch->level < 51)
	{
		for (i = 0; i < 100; i++)
		{
			if (ch->pcdata->recentkills[i] == nullptr)
				break;

			if (*(ch->pcdata->recentkills[i]) == '\0')
				break;
		}

		if (i < 95)
			ch->pcdata->recentkills[i] = palloc_string(victim->name);
	}
}